

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O0

uint8_t __thiscall
gui::ColorPicker::updateCurrentColor::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,shared_ptr<gui::MultilineTextBox> *box)

{
  int iVar1;
  int *piVar2;
  int value;
  MultilineTextBox *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_6c [13];
  wstring local_38 [16];
  String *in_stack_ffffffffffffffd8;
  int local_14 [5];
  
  std::__shared_ptr_access<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x18d06e);
  MultilineTextBox::getText(in_stack_ffffffffffffff78);
  sf::String::toWideString_abi_cxx11_(in_stack_ffffffffffffffd8);
  iVar1 = std::__cxx11::stoi((wstring *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             (size_t *)in_stack_ffffffffffffff78,0);
  std::__cxx11::wstring::~wstring(local_38);
  sf::String::~String((String *)0x18d0be);
  local_6c[1] = 0;
  local_14[0] = iVar1;
  piVar2 = std::max<int>(local_14,local_6c + 1);
  local_6c[0] = 0xff;
  piVar2 = std::min<int>(piVar2,local_6c);
  return (uint8_t)*piVar2;
}

Assistant:

void ColorPicker::updateCurrentColor(ColorSource source, bool validateSource, const std::array<float, 4>& inputHsva) {
    auto getBoxValue = [](const std::shared_ptr<MultilineTextBox>& box) {
        int value = std::stoi(box->getText().toWideString());
        return static_cast<uint8_t>(std::min(std::max(value, 0), 255));
    };

    if (source != ColorSource::none) {
        // Set current color from source.
        if (source == ColorSource::rgba) {
            try {
                sf::Color rgba = {
                    getBoxValue(rgbaTextBoxes_[0]),
                    getBoxValue(rgbaTextBoxes_[1]),
                    getBoxValue(rgbaTextBoxes_[2]),
                    getBoxValue(rgbaTextBoxes_[3])
                };
                currentColorHsva_ = convertRgbToHsv(normalizeRgb(rgba));
            } catch (const std::invalid_argument& ex) {
                GUI_DEBUG << "ColorSource::rgba failed: " << ex.what() << "\n";
            }
        } else if (source == ColorSource::hsva) {
            try {
                HsvColor hsva = {
                    getBoxValue(hsvaTextBoxes_[0]),
                    getBoxValue(hsvaTextBoxes_[1]),
                    getBoxValue(hsvaTextBoxes_[2]),
                    getBoxValue(hsvaTextBoxes_[3])
                };
                currentColorHsva_ = normalizeHsv(hsva);
            } catch (const std::invalid_argument& ex) {
                GUI_DEBUG << "ColorSource::hsva failed: " << ex.what() << "\n";
            }
        } else if (source == ColorSource::rgbaHex) {
            try {
                sf::Color rgba(static_cast<uint32_t>(std::stoll(rgbaHexTextBox_->getText().toWideString(), nullptr, 16)));
                currentColorHsva_ = convertRgbToHsv(normalizeRgb(rgba));
            } catch (const std::invalid_argument& ex) {
                GUI_DEBUG << "ColorSource::rgbaHex failed: " << ex.what() << "\n";
            }
        } else if (source == ColorSource::inputHsva) {
            currentColorHsva_ = inputHsva;
            validateSource = true;
        }

        // Fill in text boxes from current color.
        const sf::Color roundedRgba = denormalizeRgb(convertHsvToRgb(currentColorHsva_));
        const HsvColor roundedHsva = denormalizeHsv(currentColorHsva_);
        if (source != ColorSource::rgba || validateSource) {
            for (auto& box : rgbaTextBoxes_) {
                box->onTextChange.setEnabled(false);
            }
            rgbaTextBoxes_[0]->setText(std::to_string(static_cast<int>(roundedRgba.r)));
            rgbaTextBoxes_[1]->setText(std::to_string(static_cast<int>(roundedRgba.g)));
            rgbaTextBoxes_[2]->setText(std::to_string(static_cast<int>(roundedRgba.b)));
            rgbaTextBoxes_[3]->setText(std::to_string(static_cast<int>(roundedRgba.a)));
            for (auto& box : rgbaTextBoxes_) {
                box->onTextChange.setEnabled(true);
            }
        }
        if (source != ColorSource::hsva || validateSource) {
            for (auto& box : hsvaTextBoxes_) {
                box->onTextChange.setEnabled(false);
            }
            hsvaTextBoxes_[0]->setText(std::to_string(static_cast<int>(roundedHsva.h)));
            hsvaTextBoxes_[1]->setText(std::to_string(static_cast<int>(roundedHsva.s)));
            hsvaTextBoxes_[2]->setText(std::to_string(static_cast<int>(roundedHsva.v)));
            hsvaTextBoxes_[3]->setText(std::to_string(static_cast<int>(roundedHsva.a)));
            for (auto& box : hsvaTextBoxes_) {
                box->onTextChange.setEnabled(true);
            }
        }
        if (source != ColorSource::rgbaHex || validateSource) {
            std::stringstream ss;
            ss << std::setfill('0') << std::setw(8) << std::hex << roundedRgba.toInteger();
            rgbaHexTextBox_->onTextChange.setEnabled(false);
            rgbaHexTextBox_->setText(ss.str());
            rgbaHexTextBox_->onTextChange.setEnabled(true);
        }

        hueSlider_->onValueChange.setEnabled(false);
        alphaSlider_->onValueChange.setEnabled(false);
        hueSlider_->setValue(currentColorHsva_[0]);
        alphaSlider_->setValue(1.0f - currentColorHsva_[3]);
        hueSlider_->onValueChange.setEnabled(true);
        alphaSlider_->onValueChange.setEnabled(true);

        if (roundedColorRgba_ != roundedRgba) {
            roundedColorRgba_ = roundedRgba;
            onColorChange.emit(this, roundedRgba);
        }
    }

    /**
     * To display the `shadingRectangle_`, we build a grid of triangles to
     * approximate a linearly interpolated color area. This does not work with
     * just two triangles as the interpolation of vertex coords in OpenGL uses
     * barycentric coordinates.
     * 
     * Example showing vertex indices forming the TriangleStrip, here the
     * `gridSideCount` is set to 3:
     * 
     *  0----2----4----6
     *  |  / |  / |  / |
     *  | /  | /  | /  |
     *  1----3----5----7
     * 14---12---10----8
     *  | \  | \  | \  |
     *  |  \ |  \ |  \ |
     * 15---13---11----9
     * 16---18---20---22
     *  |  / |  / |  / |
     *  | /  | /  | /  |
     * 17---19---21---23
     */

    constexpr int gridSideCount = 16;
    const sf::Vector2f shadingRectangleSize = getShadingRectangleSize();
    const sf::Vector2f gridSize = shadingRectangleSize / static_cast<float>(gridSideCount);

    const float hue = hueSlider_->getValue();
    shadingRectangle_.resize(2 * (gridSideCount + 1) * gridSideCount);

    int i = 0;
    for (int y = 0; y < gridSideCount; ++y) {
        int dx = 1 - (y % 2) * 2;
        int xStart = (y % 2 == 0 ? 0 : gridSideCount);
        int xStop = gridSideCount - xStart + dx;

        for (int x = xStart; x != xStop; x += dx) {
            sf::Color topColor, bottomColor;
            if (y == 0) {
                sf::Vector3f top = convertHsvToRgb(sf::Vector3f(hue, static_cast<float>(x) / gridSideCount, 1.0f - static_cast<float>(y) / gridSideCount));
                topColor = {
                    static_cast<uint8_t>(std::lround(top.x * 255.0f)),
                    static_cast<uint8_t>(std::lround(top.y * 255.0f)),
                    static_cast<uint8_t>(std::lround(top.z * 255.0f))
                };
            } else {
                topColor = shadingRectangle_[i - std::abs(x - xStart) * 4 - 1].color;
            }
            sf::Vector3f bottom = convertHsvToRgb(sf::Vector3f(hue, static_cast<float>(x) / gridSideCount, 1.0f - static_cast<float>(y + 1) / gridSideCount));
            bottomColor = {
                static_cast<uint8_t>(std::lround(bottom.x * 255.0f)),
                static_cast<uint8_t>(std::lround(bottom.y * 255.0f)),
                static_cast<uint8_t>(std::lround(bottom.z * 255.0f))
            };

            shadingRectangle_[i++] = {{x * gridSize.x, y * gridSize.y}, topColor};
            shadingRectangle_[i++] = {{x * gridSize.x, (y + 1) * gridSize.y}, bottomColor};
        }
    }
    assert(i == static_cast<int>(shadingRectangle_.getVertexCount()));

    requestRedraw();
}